

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

void __thiscall aiMetadata::aiMetadata(aiMetadata *this,aiMetadata *rhs)

{
  undefined4 uVar1;
  undefined8 uVar2;
  uint uVar3;
  aiString *paVar4;
  aiMetadataEntry *paVar5;
  void *pvVar6;
  uint *puVar7;
  undefined8 *puVar8;
  size_t i_1;
  aiString *paVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  aiString v;
  
  uVar12 = (ulong)rhs->mNumProperties;
  this->mNumProperties = rhs->mNumProperties;
  this->mKeys = (aiString *)0x0;
  this->mValues = (aiMetadataEntry *)0x0;
  paVar4 = (aiString *)operator_new__(uVar12 * 0x404);
  if (uVar12 != 0) {
    paVar9 = paVar4;
    do {
      paVar9->length = 0;
      paVar9->data[0] = '\0';
      memset(paVar9->data + 1,0x1b,0x3ff);
      paVar9 = paVar9 + 1;
    } while (paVar9 != paVar4 + uVar12);
  }
  this->mKeys = paVar4;
  lVar10 = 4;
  for (uVar11 = 0; uVar11 < uVar12; uVar11 = uVar11 + 1) {
    paVar4 = rhs->mKeys;
    paVar9 = this->mKeys;
    if (paVar9 != paVar4) {
      uVar3 = *(uint *)(paVar4->data + lVar10 + -8);
      *(uint *)(paVar9->data + lVar10 + -8) = uVar3;
      memcpy(paVar9->data + lVar10 + -4,paVar4->data + lVar10 + -4,(ulong)uVar3);
      (paVar9->data + lVar10 + -4)[uVar3] = '\0';
      uVar12 = (ulong)this->mNumProperties;
    }
    lVar10 = lVar10 + 0x404;
  }
  paVar5 = (aiMetadataEntry *)operator_new__(uVar12 << 4);
  this->mValues = paVar5;
  lVar10 = 0;
  lVar13 = 0;
  uVar11 = 0;
  do {
    if (uVar12 <= uVar11) {
      return;
    }
    *(undefined4 *)((long)&this->mValues->mType + lVar13) =
         *(undefined4 *)((long)&rhs->mValues->mType + lVar13);
    paVar5 = rhs->mValues;
    switch(*(undefined4 *)((long)&paVar5->mType + lVar13)) {
    case 0:
      pvVar6 = operator_new(1);
      *(void **)((long)&this->mValues->mData + lVar13) = pvVar6;
      **(undefined1 **)((long)&this->mValues->mData + lVar13) =
           **(undefined1 **)((long)&rhs->mValues->mData + lVar13);
      goto switchD_003ae01c_default;
    case 1:
      uVar1 = **(undefined4 **)((long)&paVar5->mData + lVar13);
      puVar8 = (undefined8 *)operator_new(4);
      *(undefined4 *)puVar8 = uVar1;
      break;
    case 2:
      uVar2 = **(undefined8 **)((long)&paVar5->mData + lVar13);
      puVar8 = (undefined8 *)operator_new(8);
      *puVar8 = uVar2;
      break;
    case 3:
      uVar1 = **(undefined4 **)((long)&paVar5->mData + lVar13);
      puVar8 = (undefined8 *)operator_new(4);
      *(undefined4 *)puVar8 = uVar1;
      break;
    case 4:
      uVar2 = **(undefined8 **)((long)&paVar5->mData + lVar13);
      puVar8 = (undefined8 *)operator_new(8);
      *puVar8 = uVar2;
      break;
    case 5:
      v._0_8_ = v._0_8_ & 0xffffff0000000000;
      memset(v.data + 1,0x1b,0x3ff);
      Get<aiString>(rhs,(aiString *)(this->mKeys->data + lVar10 + -4),&v);
      puVar7 = (uint *)operator_new(0x404);
      uVar3 = v.length;
      if (0x3fe < v.length) {
        uVar3 = 0x3ff;
      }
      *puVar7 = uVar3;
      memcpy(puVar7 + 1,v.data,(ulong)uVar3);
      *(undefined1 *)((long)puVar7 + (ulong)uVar3 + 4) = 0;
      *(uint **)((long)&this->mValues->mData + lVar13) = puVar7;
      goto switchD_003ae01c_default;
    case 6:
      v.length = 0;
      v.data[0] = '\0';
      v.data[1] = '\0';
      v.data[2] = '\0';
      v.data[3] = '\0';
      v.data[4] = '\0';
      v.data[5] = '\0';
      v.data[6] = '\0';
      v.data[7] = '\0';
      Get<aiVector3t<float>>
                (rhs,(aiString *)(this->mKeys->data + lVar10 + -4),(aiVector3t<float> *)&v);
      puVar8 = (undefined8 *)operator_new(0xc);
      *puVar8 = v._0_8_;
      *(undefined4 *)(puVar8 + 1) = v.data._4_4_;
      break;
    default:
      goto switchD_003ae01c_default;
    }
    *(undefined8 **)((long)&this->mValues->mData + lVar13) = puVar8;
switchD_003ae01c_default:
    uVar11 = uVar11 + 1;
    uVar12 = (ulong)this->mNumProperties;
    lVar13 = lVar13 + 0x10;
    lVar10 = lVar10 + 0x404;
  } while( true );
}

Assistant:

aiMetadata( const aiMetadata &rhs )
    : mNumProperties( rhs.mNumProperties )
    , mKeys( nullptr )
    , mValues( nullptr ) {
        mKeys = new aiString[ mNumProperties ];
        for ( size_t i = 0; i < static_cast<size_t>( mNumProperties ); ++i ) {
            mKeys[ i ] = rhs.mKeys[ i ];
        }
        mValues = new aiMetadataEntry[ mNumProperties ];
        for ( size_t i = 0; i < static_cast<size_t>(mNumProperties); ++i ) {
            mValues[ i ].mType = rhs.mValues[ i ].mType;
            switch ( rhs.mValues[ i ].mType ) {
            case AI_BOOL:
                mValues[ i ].mData = new bool;
                ::memcpy( mValues[ i ].mData, rhs.mValues[ i ].mData, sizeof(bool) );
                break;
            case AI_INT32: {
                int32_t v;
                ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( int32_t ) );
                mValues[ i ].mData = new int32_t( v );
                }
                break;
            case AI_UINT64: {
                    uint64_t v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( uint64_t ) );
                    mValues[ i ].mData = new  uint64_t( v );
                }
                break;
            case AI_FLOAT: {
                    float v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( float ) );
                    mValues[ i ].mData = new float( v );
                }
                break;
            case AI_DOUBLE: {
                    double v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( double ) );
                    mValues[ i ].mData = new double( v );
                }
                break;
            case AI_AISTRING: {
                    aiString v;
                    rhs.Get<aiString>( mKeys[ i ], v );
                    mValues[ i ].mData = new aiString( v );
                }
                break;
            case AI_AIVECTOR3D: {
                    aiVector3D v;
                    rhs.Get<aiVector3D>( mKeys[ i ], v );
                    mValues[ i ].mData = new aiVector3D( v );
                }
                break;
#ifndef SWIG
            case FORCE_32BIT:
#endif
            default:
                break;
            }

        }
    }